

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::clear(Value *this)

{
  byte bVar1;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  bVar1 = (byte)*(ushort *)&this->bits_;
  if ((1 < bVar1 - 6) && (bVar1 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"in Json::Value::clear(): requires complex value",0x2f);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  }
  this->start_ = 0;
  this->limit_ = 0;
  if ((*(ushort *)&this->bits_ & 0xfe) == 6) {
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::clear(&((this->value_).map_)->_M_t);
    return;
  }
  return;
}

Assistant:

void Value::clear() {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue ||
                          type() == objectValue,
                      "in Json::Value::clear(): requires complex value");
  start_ = 0;
  limit_ = 0;
  switch (type()) {
  case arrayValue:
  case objectValue:
    value_.map_->clear();
    break;
  default:
    break;
  }
}